

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramFunctor,int,duckdb::DefaultMapType<std::map<int,unsigned_long,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  bool bVar1;
  HistogramAggState<int,_std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
  **ppHVar2;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  *this;
  idx_t iVar3;
  ulong in_RCX;
  UnifiedVectorFormat *in_R8;
  int *input_value;
  HistogramAggState<int,_std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
  *state;
  idx_t idx;
  idx_t i;
  int *input_values;
  HistogramAggState<int,_std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
  **states;
  UnifiedVectorFormat input_data;
  bool extra_state;
  UnifiedVectorFormat sdata;
  Vector *input;
  UnifiedVectorFormat *in_stack_fffffffffffffec8;
  UnifiedVectorFormat *in_stack_fffffffffffffed0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  Vector *in_stack_fffffffffffffee0;
  HistogramAggState<int,_std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
  **ppHVar4;
  HistogramAggState<int,_std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
  *__k;
  UnifiedVectorFormat *local_e8;
  SelectionVector *local_d0 [9];
  undefined1 local_85;
  SelectionVector *local_78 [10];
  UnifiedVectorFormat *local_28;
  ulong local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  local_85 = HistogramFunctor::CreateExtraState((idx_t)local_28);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_d0);
  HistogramFunctor::PrepareData
            (in_stack_fffffffffffffee0,(idx_t)in_stack_fffffffffffffed8,
             (bool *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  ppHVar2 = UnifiedVectorFormat::
            GetData<duckdb::HistogramAggState<int,std::map<int,unsigned_long,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>>*>
                      ((UnifiedVectorFormat *)local_78);
  UnifiedVectorFormat::GetData<int>((UnifiedVectorFormat *)local_d0);
  for (local_e8 = (UnifiedVectorFormat *)0x0; local_e8 < local_28; local_e8 = local_e8 + 1) {
    this = (map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
            *)SelectionVector::get_index(local_d0[0],(idx_t)local_e8);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffed8,(idx_t)in_stack_fffffffffffffed0);
    if (bVar1) {
      ppHVar4 = ppHVar2;
      iVar3 = SelectionVector::get_index(local_78[0],(idx_t)local_e8);
      __k = ppHVar4[iVar3];
      if (__k->hist ==
          (map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
           *)0x0) {
        in_stack_fffffffffffffed8 =
             (TemplatedValidityMask<unsigned_long> *)
             DefaultMapType<std::map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>_>
             ::CreateEmpty((ArenaAllocator *)in_stack_fffffffffffffed0);
        __k->hist = (map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                     *)in_stack_fffffffffffffed8;
      }
      in_stack_fffffffffffffed0 =
           (UnifiedVectorFormat *)
           std::
           map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
           ::operator[](this,(key_type_conflict4 *)__k);
      *(mapped_type *)in_stack_fffffffffffffed0 = *(mapped_type *)in_stack_fffffffffffffed0 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffed0);
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffed0);
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}